

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O1

void yin_print_snode_common
               (lyout *out,int level,lys_node *node,lys_module *module,int *par_close_flag,int mask)

{
  ushort uVar1;
  int iVar2;
  lys_node *plVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (((mask & 1U) != 0) && (node->ext_size != '\0')) {
    if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
      *par_close_flag = 1;
      ly_print(out,">\n");
    }
    yin_print_extension_instances
              (out,level,module,LYEXT_SUBSTMT_SELF,'\0',node->ext,(uint)node->ext_size);
  }
  if (((mask & 2U) != 0) && (node->iffeature_size != '\0')) {
    lVar4 = 0;
    uVar6 = 0;
    do {
      if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
        *par_close_flag = 1;
        ly_print(out,">\n");
      }
      yin_print_iffeature(out,level,module,(lys_iffeature *)((long)&node->iffeature->expr + lVar4));
      uVar6 = uVar6 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar6 < node->iffeature_size);
  }
  if ((mask & 4U) != 0) {
    iVar2 = lys_ext_iter(node->ext,node->ext_size,'\0',LYEXT_SUBSTMT_CONFIG);
    plVar3 = lys_parent(node);
    uVar1 = node->flags;
    if (plVar3 == (lys_node *)0x0) {
      if ((uVar1 & 2) == 0) {
        if (iVar2 != -1) goto LAB_00192859;
      }
      else {
LAB_00192862:
        pcVar5 = "false";
LAB_00192869:
        if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
          *par_close_flag = 1;
          ly_print(out,">\n");
        }
        yin_print_substmt(out,level,LYEXT_SUBSTMT_CONFIG,'\0',pcVar5,module,node->ext,
                          (uint)node->ext_size);
      }
    }
    else if (iVar2 != -1 || (uVar1 & 4) != 0) {
      if ((uVar1 & 1) != 0) {
LAB_00192859:
        pcVar5 = "true";
        goto LAB_00192869;
      }
      if ((uVar1 & 2) != 0) goto LAB_00192862;
    }
  }
  if (((mask & 8U) != 0) && ((node->nodetype & (LYS_ANYDATA|LYS_LEAF|LYS_CHOICE)) != LYS_UNKNOWN)) {
    if ((node->flags & 0x40) == 0) {
      if (-1 < (char)node->flags) goto LAB_0019292a;
      pcVar5 = "false";
    }
    else {
      pcVar5 = "true";
    }
    if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
      *par_close_flag = 1;
      ly_print(out,">\n");
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_MANDATORY,'\0',pcVar5,module,node->ext,
                      (uint)node->ext_size);
  }
LAB_0019292a:
  if ((mask & 0x10U) == 0) goto LAB_001929a8;
  uVar1 = node->flags;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 0x10) != 0) {
      pcVar5 = "deprecated";
      goto LAB_0019295e;
    }
    if ((uVar1 & 0x20) != 0) {
      pcVar5 = "obsolete";
      goto LAB_0019295e;
    }
    pcVar5 = (char *)0x0;
  }
  else {
    pcVar5 = "current";
LAB_0019295e:
    if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
      *par_close_flag = 1;
      ly_print(out,">\n");
    }
  }
  yin_print_substmt(out,level,LYEXT_SUBSTMT_STATUS,'\0',pcVar5,module,node->ext,(uint)node->ext_size
                   );
LAB_001929a8:
  if (((mask & 0x20U) != 0) && (node->dsc != (char *)0x0)) {
    if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
      *par_close_flag = 1;
      ly_print(out,">\n");
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_DESCRIPTION,'\0',node->dsc,module,node->ext,
                      (uint)node->ext_size);
  }
  if (((mask & 0x40U) != 0) && (node->ref != (char *)0x0)) {
    if ((par_close_flag != (int *)0x0) && (*par_close_flag == 0)) {
      *par_close_flag = 1;
      ly_print(out,">\n");
    }
    yin_print_substmt(out,level,LYEXT_SUBSTMT_REFERENCE,'\0',node->ref,module,node->ext,
                      (uint)node->ext_size);
  }
  return;
}

Assistant:

static void
yin_print_snode_common(struct lyout *out, int level, const struct lys_node *node, const struct lys_module *module,
                       int *par_close_flag, int mask)
{
    int i;
    const char *status = NULL;

    /* extensions */
    if ((mask & SNODE_COMMON_EXT) && node->ext_size) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, node->ext, node->ext_size);
    }

    /* if-features */
    if (mask & SNODE_COMMON_IFF) {
        for (i = 0; i < node->iffeature_size; ++i) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_iffeature(out, level, module, &node->iffeature[i]);
        }
    }

    /* config */
    if (mask & SNODE_COMMON_CONFIG) {
        /* get info if there is an extension for the config statement */
        i = lys_ext_iter(node->ext, node->ext_size, 0, LYEXT_SUBSTMT_CONFIG);

        if (lys_parent(node)) {
            if ((node->flags & LYS_CONFIG_SET) || i != -1) {
                /* print config when it differs from the parent or if it has an extension instance ... */
                if (node->flags & LYS_CONFIG_W) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                                      module, node->ext, node->ext_size);
                } else if (node->flags & LYS_CONFIG_R) {
                    yin_print_close_parent(out, par_close_flag);
                    yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                                      module, node->ext, node->ext_size);
                }
            }
        } else if (node->flags & LYS_CONFIG_R) {
            /* ... or it's a top-level state node */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false",
                              module, node->ext, node->ext_size);
        } else if (i != -1) {
            /* the config has an extension, so we have to print it */
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true",
                              module, node->ext, node->ext_size);
        }
    }

    /* mandatory */
    if ((mask & SNODE_COMMON_MAND) && (node->nodetype & (LYS_LEAF | LYS_CHOICE | LYS_ANYDATA))) {
        if (node->flags & LYS_MAND_TRUE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true",
                              module, node->ext, node->ext_size);
        } else if (node->flags & LYS_MAND_FALSE) {
            yin_print_close_parent(out, par_close_flag);
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false",
                              module, node->ext, node->ext_size);
        }
    }

    /* status */
    if (mask & SNODE_COMMON_STATUS) {
        if (node->flags & LYS_STATUS_CURR) {
            yin_print_close_parent(out, par_close_flag);
            status = "current";
        } else if (node->flags & LYS_STATUS_DEPRC) {
            yin_print_close_parent(out, par_close_flag);
            status = "deprecated";
        } else if (node->flags & LYS_STATUS_OBSLT) {
            yin_print_close_parent(out, par_close_flag);
            status = "obsolete";
        }
        yin_print_substmt(out, level, LYEXT_SUBSTMT_STATUS, 0, status, module, node->ext, node->ext_size);
    }

    /* description */
    if ((mask & SNODE_COMMON_DSC) && node->dsc) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, node->dsc,
                           module, node->ext, node->ext_size);
    }

    /* reference */
    if ((mask & SNODE_COMMON_REF) && node->ref) {
        yin_print_close_parent(out, par_close_flag);
        yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, node->ref,
                          module, node->ext, node->ext_size);
    }
}